

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::commit(raft_server *this,ulong target_idx)

{
  __node_base _Var1;
  bool bVar2;
  srv_role sVar3;
  int iVar4;
  __int_type_conflict leader_id;
  pointer psVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  size_t *psVar7;
  element_type *peVar8;
  undefined4 extraout_var_00;
  __int_type _Var9;
  __int_type _Var10;
  element_type *peVar11;
  _List_node_base *p_Var12;
  context *this_00;
  element_type *peVar13;
  pointer in_RSI;
  long in_RDI;
  Param param;
  ulong local_idx;
  ulong leader_idx;
  unique_lock<std::mutex> lock;
  nuraft_global_mgr *mgr;
  ptr<peer> pp;
  peer_itor it;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  ptr<peer> *in_stack_00000300;
  raft_server *in_stack_00000308;
  undefined4 in_stack_fffffffffffffd38;
  int32_t my_id;
  undefined4 in_stack_fffffffffffffd3c;
  uint uVar14;
  unique_lock<std::mutex> *in_stack_fffffffffffffd40;
  Type type;
  _List_node_base *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  bool bVar15;
  int in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  nuraft_global_mgr *in_stack_fffffffffffffe00;
  Param local_1b8;
  byte local_199;
  unique_lock<std::mutex> *local_188;
  _List_node_base *local_180;
  string local_168 [48];
  string local_138 [32];
  nuraft_global_mgr *local_118;
  string local_110 [48];
  undefined1 local_e0 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_c0 [3];
  string local_a8 [32];
  pointer local_88;
  unique_lock<std::mutex> *local_78;
  memory_order local_70;
  int local_6c;
  context *local_68;
  _List_node_base *local_60;
  memory_order local_58;
  int local_54;
  _List_node_base *local_50;
  size_t local_48;
  memory_order local_40;
  int local_3c;
  size_t *local_38;
  __node_base local_30;
  memory_order local_28;
  int local_24;
  undefined8 *local_20;
  size_t local_18;
  memory_order local_10;
  int local_c;
  undefined8 local_8;
  
  local_88 = in_RSI;
  psVar5 = (pointer)std::__atomic_base::operator_cast_to_unsigned_long
                              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffd48);
  if (psVar5 < in_RSI) {
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (__int_type)in_stack_fffffffffffffd48);
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (__int_type)in_stack_fffffffffffffd48);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d8c30);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (4 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d8c56);
        psVar7 = (size_t *)(in_RDI + 0xa0);
        local_c = 5;
        local_8 = psVar7;
        local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_c - 1U < 2) {
          local_18 = *psVar7;
        }
        else if (local_c == 5) {
          local_18 = *psVar7;
        }
        else {
          local_18 = *psVar7;
        }
        msg_if_given_abi_cxx11_((char *)local_a8,"trigger commit upto %lu",local_18);
        (*peVar11->_vptr_logger[8])
                  (peVar11,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit",0x2d,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
    }
    sVar3 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d8daf);
    if (sVar3 == leader) {
      local_e0._24_8_ =
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_stack_fffffffffffffd40,
                 (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      while( true ) {
        local_e0._16_8_ =
             std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        bVar2 = std::__detail::operator!=
                          (local_c0,(_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                     *)(local_e0 + 0x10));
        if (!bVar2) break;
        std::__detail::
        _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
        operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    *)0x1d8e30);
        in_stack_fffffffffffffe00 = (nuraft_global_mgr *)local_e0;
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd40,
                   (shared_ptr<nuraft::peer> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd40,
                   (shared_ptr<nuraft::peer> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        bVar2 = request_append_entries(in_stack_00000308,in_stack_00000300);
        in_stack_fffffffffffffdfc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdfc) ^ 0xff000000;
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1d8ea4);
        if ((in_stack_fffffffffffffdfc & 0x1000000) != 0) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1d8ebe);
          peer::set_pending_commit((peer *)0x1d8ec6);
        }
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1d8f10);
        std::__detail::
        _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
        operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    *)in_stack_fffffffffffffd40);
      }
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d8f69);
    iVar4 = (*peVar11->_vptr_logger[7])();
    if (5 < iVar4) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d8f8f);
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d8fab);
      iVar4 = (*peVar8->_vptr_log_store[2])();
      puVar6 = (undefined8 *)(in_RDI + 0xa0);
      local_24 = 5;
      local_20 = puVar6;
      local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_24 - 1U < 2) {
        local_30._M_nxt = (_Hash_node_base *)*puVar6;
      }
      else if (local_24 == 5) {
        local_30._M_nxt = (_Hash_node_base *)*puVar6;
      }
      else {
        local_30._M_nxt = (_Hash_node_base *)*puVar6;
      }
      _Var1._M_nxt = local_30._M_nxt;
      psVar7 = (size_t *)(in_RDI + 0xa8);
      local_3c = 5;
      in_stack_fffffffffffffdf8 = local_24;
      local_38 = psVar7;
      local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_3c - 1U < 2) {
        local_48 = *psVar7;
      }
      else if (local_3c == 5) {
        local_48 = *psVar7;
      }
      else {
        local_48 = *psVar7;
      }
      msg_if_given_abi_cxx11_
                ((char *)local_110,
                 "local log idx %lu, target_commit_idx %lu, quick_commit_index_ %lu, state_->get_commit_idx() %lu"
                 ,CONCAT44(extraout_var,iVar4) + -1,local_88,_Var1._M_nxt,local_48);
      (*peVar11->_vptr_logger[8])
                (peVar11,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit",0x3f,local_110);
      std::__cxx11::string::~string(local_110);
    }
  }
  peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d91f6);
  iVar4 = (*peVar8->_vptr_log_store[2])();
  _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffd48);
  if (_Var9 < CONCAT44(extraout_var_00,iVar4) - 1U) {
    _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffd48);
    _Var10 = std::__atomic_base::operator_cast_to_unsigned_long
                       ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffd48);
    if (_Var10 < _Var9) {
      local_118 = nuraft_global_mgr::get_instance();
      if (local_118 != (nuraft_global_mgr *)0x0) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar2) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d92b8);
          iVar4 = (*peVar11->_vptr_logger[7])();
          if (5 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d92de);
            msg_if_given_abi_cxx11_((char *)local_138,"request commit to global thread pool");
            (*peVar11->_vptr_logger[8])
                      (peVar11,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit",0x47,local_138);
            std::__cxx11::string::~string(local_138);
          }
        }
        std::enable_shared_from_this<nuraft::raft_server>::shared_from_this
                  ((enable_shared_from_this<nuraft::raft_server> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        nuraft_global_mgr::request_commit
                  (in_stack_fffffffffffffe00,
                   (ptr<raft_server> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                  );
        std::shared_ptr<nuraft::raft_server>::~shared_ptr
                  ((shared_ptr<nuraft::raft_server> *)0x1d93aa);
        return;
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d9406);
        iVar4 = (*peVar11->_vptr_logger[7])();
        if (5 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d942c);
          msg_if_given_abi_cxx11_((char *)local_168,"commit_cv_ notify (local thread)");
          (*peVar11->_vptr_logger[8])
                    (peVar11,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit",0x4a,local_168);
          std::__cxx11::string::~string(local_168);
        }
      }
      std::unique_lock<std::mutex>::unique_lock
                (in_stack_fffffffffffffd40,
                 (mutex_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffd40);
      return;
    }
  }
  sVar3 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d9505);
  if (sVar3 == follower) {
    p_Var12 = (_List_node_base *)(in_RDI + 0x98);
    local_54 = 5;
    local_50 = p_Var12;
    local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_54 - 1U < 2) {
      local_60 = p_Var12->_M_next;
    }
    else if (local_54 == 5) {
      local_60 = p_Var12->_M_next;
    }
    else {
      local_60 = p_Var12->_M_next;
    }
    local_180 = local_60;
    this_00 = (context *)(in_RDI + 0xa8);
    local_6c = 5;
    local_68 = this_00;
    local_70 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_6c - 1U < 2) {
      local_78 = (unique_lock<std::mutex> *)
                 (this_00->state_mgr_).
                 super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else if (local_6c == 5) {
      local_78 = (unique_lock<std::mutex> *)
                 (this_00->state_mgr_).
                 super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      local_78 = (unique_lock<std::mutex> *)
                 (this_00->state_mgr_).
                 super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    local_188 = local_78;
    bVar2 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffffd48,
                       (memory_order)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    local_199 = 0;
    bVar15 = false;
    if (!bVar2) {
      in_stack_fffffffffffffd40 = local_188;
      in_stack_fffffffffffffd48 = local_180;
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d96bc);
      nuraft::context::get_params(this_00);
      local_199 = 1;
      peVar13 = std::
                __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d96e1);
      bVar15 = in_stack_fffffffffffffd48 <
               (_List_node_base *)
               ((long)&((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                       &in_stack_fffffffffffffd40->_M_device)->_M_ptr +
               (long)peVar13->fresh_log_gap_);
    }
    uVar14 = CONCAT13(bVar15,(int3)in_stack_fffffffffffffd3c);
    if ((local_199 & 1) != 0) {
      std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1d9720)
      ;
    }
    if ((uVar14 & 0x1000000) != 0) {
      std::atomic<bool>::store
                ((atomic<bool> *)in_stack_fffffffffffffd48,
                 SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0),
                 (memory_order)in_stack_fffffffffffffd40);
      type = (Type)((ulong)in_stack_fffffffffffffd40 >> 0x20);
      my_id = *(int32_t *)(in_RDI + 0x38);
      leader_id = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffd48);
      cb_func::Param::Param(&local_1b8,my_id,leader_id,-1,(void *)0x0);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d978f);
      cb_func::call((cb_func *)in_stack_fffffffffffffd48,type,(Param *)CONCAT44(uVar14,my_id));
    }
  }
  return;
}

Assistant:

void raft_server::commit(ulong target_idx) {
    if (target_idx > quick_commit_index_) {
        quick_commit_index_ = target_idx;
        lagging_sm_target_index_ = target_idx;
        p_db( "trigger commit upto %" PRIu64 "", quick_commit_index_.load() );

        // if this is a leader notify peers to commit as well
        // for peers that are free, send the request, otherwise,
        // set pending commit flag for that peer
        if (role_ == srv_role::leader) {
            for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
                ptr<peer> pp = it->second;
                if (!request_append_entries(pp)) {
                    pp->set_pending_commit();
                }
            }
        }
    }

    p_tr( "local log idx %" PRIu64 ", target_commit_idx %" PRIu64 ", "
          "quick_commit_index_ %" PRIu64 ", state_->get_commit_idx() %" PRIu64 "",
          log_store_->next_slot() - 1, target_idx,
          quick_commit_index_.load(), sm_commit_index_.load() );

    if ( log_store_->next_slot() - 1 > sm_commit_index_ &&
         quick_commit_index_ > sm_commit_index_ ) {

        nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
        if (mgr) {
            // Global thread pool exists, request it.
            p_tr("request commit to global thread pool");
            mgr->request_commit( this->shared_from_this() );
        } else {
            p_tr("commit_cv_ notify (local thread)");
            std::unique_lock<std::mutex> lock(commit_cv_lock_);
            commit_cv_.notify_one();
        }

    } else {
        /*
         * After raft server (re-)start, if its log entry is as fresh as leader,
         * then commit thread will not be notified. But we need to tell the app,
         * whose status rely on raft server, that now raft server is fresh.
         */
        if (role_ == srv_role::follower) {
            ulong leader_idx = leader_commit_index_.load();
            ulong local_idx = sm_commit_index_.load();
            if (!data_fresh_.load() &&
                leader_idx < local_idx + ctx_->get_params()->fresh_log_gap_) {
                data_fresh_.store(true);
                cb_func::Param param(id_, leader_);
                (void) ctx_->cb_func_.call(cb_func::BecomeFresh, &param);
            }
        }
    }
}